

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::FeatureType::MergePartialFromCodedStream
          (FeatureType *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  bool bVar5;
  short extraout_AX;
  int iVar6;
  uint32 uVar7;
  Int64FeatureType *this_00;
  ulong extraout_RAX;
  ArrayFeatureType *this_01;
  ulong extraout_RAX_00;
  StringFeatureType *this_02;
  ulong extraout_RAX_01;
  ImageFeatureType *this_03;
  ulong extraout_RAX_02;
  DoubleFeatureType *this_04;
  ulong extraout_RAX_03;
  DictionaryFeatureType *this_05;
  ulong extraout_RAX_04;
  SequenceFeatureType *this_06;
  ulong extraout_RAX_05;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  int local_44;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar9 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = (uint)bVar2, (~(uint)*pbVar1 & uVar9) < 0x80)
           ) goto LAB_001d8844;
        uVar9 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = (ulong)uVar9 | 0x100000000;
    }
    else {
LAB_001d8844:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    uVar9 = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_001d856f:
      iVar6 = 7;
      if ((uVar9 & 7) != 4 && uVar9 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
        if (bVar5) goto LAB_001d859a;
LAB_001d883a:
        iVar6 = 6;
      }
    }
    else {
      uVar4 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar10;
      switch(uVar4) {
      case 1:
        if (cVar8 != '\n') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 1) {
          clear_Type(this);
          this->_oneof_case_[0] = 1;
          this_00 = (Int64FeatureType *)operator_new(0x18);
          Int64FeatureType::Int64FeatureType(this_00);
          (this->Type_).int64type_ = this_00;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX;
        break;
      case 2:
        if (cVar8 != '\x12') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 2) {
          clear_Type(this);
          this->_oneof_case_[0] = 2;
          this_04 = (DoubleFeatureType *)operator_new(0x18);
          DoubleFeatureType::DoubleFeatureType(this_04);
          (this->Type_).doubletype_ = this_04;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_03;
        break;
      case 3:
        if (cVar8 != '\x1a') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 3) {
          clear_Type(this);
          this->_oneof_case_[0] = 3;
          this_02 = (StringFeatureType *)operator_new(0x18);
          StringFeatureType::StringFeatureType(this_02);
          (this->Type_).stringtype_ = this_02;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_01;
        break;
      case 4:
        if (cVar8 != '\"') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 4) {
          clear_Type(this);
          this->_oneof_case_[0] = 4;
          this_03 = (ImageFeatureType *)operator_new(0x38);
          ImageFeatureType::ImageFeatureType(this_03);
          (this->Type_).imagetype_ = this_03;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_02;
        break;
      case 5:
        if (cVar8 != '*') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 5) {
          clear_Type(this);
          this->_oneof_case_[0] = 5;
          this_01 = (ArrayFeatureType *)operator_new(0x48);
          ArrayFeatureType::ArrayFeatureType(this_01);
          (this->Type_).multiarraytype_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_00;
        break;
      case 6:
        if (cVar8 != '2') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 6) {
          clear_Type(this);
          this->_oneof_case_[0] = 6;
          this_05 = (DictionaryFeatureType *)operator_new(0x20);
          DictionaryFeatureType::DictionaryFeatureType(this_05);
          (this->Type_).dictionarytype_ = this_05;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_04;
        break;
      case 7:
        if (cVar8 != ':') goto LAB_001d856f;
        if (this->_oneof_case_[0] != 7) {
          clear_Type(this);
          this->_oneof_case_[0] = 7;
          this_06 = (SequenceFeatureType *)operator_new(0x28);
          SequenceFeatureType::SequenceFeatureType(this_06);
          (this->Type_).sequencetype_ = this_06;
        }
        MergePartialFromCodedStream();
        uVar10 = extraout_RAX_05;
        break;
      default:
        if (uVar4 != 1000) goto LAB_001d856f;
        MergePartialFromCodedStream();
        if (extraout_AX == 1) goto LAB_001d883a;
        if (extraout_AX == 0) goto LAB_001d856f;
        goto LAB_001d859a;
      }
      iVar6 = local_44;
      if ((uVar10 & 1) == 0) {
LAB_001d859a:
        iVar6 = 0;
      }
    }
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool FeatureType::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.FeatureType)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Int64FeatureType int64Type = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64type()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleFeatureType doubleType = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_doubletype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringFeatureType stringType = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringtype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ImageFeatureType imageType = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imagetype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ArrayFeatureType multiArrayType = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_multiarraytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DictionaryFeatureType dictionaryType = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dictionarytype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SequenceFeatureType sequenceType = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sequencetype()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isOptional = 1000;
      case 1000: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8000u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isoptional_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.FeatureType)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.FeatureType)
  return false;
#undef DO_
}